

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder.cpp
# Opt level: O3

disp_binding_activator_t * __thiscall
so_5::impl::pre5_5_19_default_disp_binder_t::bind_agent
          (disp_binding_activator_t *__return_storage_ptr__,pre5_5_19_default_disp_binder_t *this,
          environment_t *env,agent_ref_t *agent)

{
  atomic_refcounted_t *paVar1;
  agent_t *paVar2;
  disp_binder_t *pdVar3;
  char cVar4;
  disp_binder_t *pdVar5;
  disp_binder_t *local_28;
  
  LOCK();
  cVar4 = (this->m_lock).m_flag.super___atomic_flag_base._M_i;
  (this->m_lock).m_flag.super___atomic_flag_base._M_i = true;
  UNLOCK();
  while (cVar4 != '\0') {
    sched_yield();
    LOCK();
    cVar4 = (this->m_lock).m_flag.super___atomic_flag_base._M_i;
    (this->m_lock).m_flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  }
  pdVar5 = (this->m_actual_binder)._M_t.
           super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
           _M_t.
           super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
           super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  if (pdVar5 == (disp_binder_t *)0x0) {
    environment_t::so_make_default_disp_binder((environment_t *)&local_28);
    pdVar3 = local_28;
    local_28 = (disp_binder_t *)0x0;
    pdVar5 = (this->m_actual_binder)._M_t.
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
    (this->m_actual_binder)._M_t.
    super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t.
    super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
    super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl = pdVar3;
    if (pdVar5 != (disp_binder_t *)0x0) {
      (*pdVar5->_vptr_disp_binder_t[1])();
      if (local_28 != (disp_binder_t *)0x0) {
        (*local_28->_vptr_disp_binder_t[1])();
      }
    }
    pdVar5 = (this->m_actual_binder)._M_t.
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  }
  (this->m_lock).m_flag.super___atomic_flag_base._M_i = false;
  paVar2 = agent->m_obj;
  agent->m_obj = (agent_t *)0x0;
  (*pdVar5->_vptr_disp_binder_t[2])(__return_storage_ptr__,pdVar5,env);
  if (paVar2 != (agent_t *)0x0) {
    LOCK();
    paVar1 = &paVar2->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (paVar2 != (agent_t *)0x0)) {
      (*paVar2->_vptr_agent_t[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & env,
			agent_ref_t agent ) override
			{
				// Actual binder must be created if necessary.
				{
					std::lock_guard< default_spinlock_t > lock( m_lock );
					if( !m_actual_binder )
						m_actual_binder = env.so_make_default_disp_binder();
				}
				return m_actual_binder->bind_agent( env, std::move(agent) );
			}